

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O3

int CorrelationMeter::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = CorrelationMeter::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    if (1 < numsamples) {
      iVar3 = *(int *)((long)pvVar1 + 0x1c);
      iVar4 = *(int *)((long)pvVar1 + 0xc);
      lVar2 = *(long *)((long)pvVar1 + 0x10);
      uVar5 = 0;
      do {
        buffer[uVar5] = *(float *)(lVar2 + (long)iVar4 * 4);
        if (iVar4 < 1) {
          iVar4 = *(int *)((long)pvVar1 + 8);
        }
        if (uVar5 + 1 < (ulong)(uint)numsamples) {
          buffer[uVar5 + 1] = *(float *)(*(long *)((long)pvVar1 + 0x20) + (long)iVar3 * 4);
        }
        if (iVar3 < 1) {
          iVar3 = *(int *)((long)pvVar1 + 0x18);
        }
        iVar4 = iVar4 + -1;
        iVar3 = iVar3 + -1;
        uVar5 = uVar5 + 2;
      } while ((numsamples & 0xfffffffe) != uVar5);
    }
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = CorrelationMeter::EffectData]"
               );
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        HistoryBuffer& l = data->history[0];
        HistoryBuffer& r = data->history[1];
        int w1 = l.writeindex;
        int w2 = r.writeindex;
        for (int n = 0; n < numsamples / 2; n++)
        {
            buffer[n * 2 + 0] = l.data[w1];
            if (--w1 < 0)
                w1 = l.length - 1;
            if (n * 2 + 1 < numsamples)
                buffer[n * 2 + 1] = r.data[w2];
            if (--w2 < 0)
                w2 = r.length - 1;
        }
        return UNITY_AUDIODSP_OK;
    }